

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O2

exr_result_t save_attr_sz(exr_context_t ctxt,size_t sz)

{
  exr_result_t eVar1;
  long lStack_8;
  int32_t isz;
  
  if (sz >> 0x1f != 0) {
    lStack_8 = 3;
    eVar1 = (*ctxt->standard_error)(ctxt,3);
    return eVar1;
  }
  lStack_8 = sz << 0x20;
  eVar1 = (*ctxt->do_write)(ctxt,&isz,4,&ctxt->output_file_offset);
  return eVar1;
}

Assistant:

static exr_result_t
save_attr_sz (exr_context_t ctxt, size_t sz)
{
    int32_t isz;

    if (sz > (size_t) INT32_MAX)
        return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);

    isz = (int32_t) sz;
    priv_from_native32 (&isz, 1);

    return ctxt->do_write (
        ctxt, &isz, sizeof (int32_t), &(ctxt->output_file_offset));
}